

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O1

IOStream * __thiscall Assimp::MemoryIOSystem::Open(MemoryIOSystem *this,char *pFile,char *pMode)

{
  pointer *pppIVar1;
  IOSystem *pIVar2;
  iterator __position;
  uint8_t *puVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  IOStream *pIVar6;
  MemoryIOStream *local_20;
  
  iVar5 = strncmp(pFile,"$$$___magic___$$$",0x11);
  if (iVar5 == 0) {
    local_20 = (MemoryIOStream *)operator_new(0x28);
    puVar3 = this->buffer;
    sVar4 = this->length;
    (local_20->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_00258628;
    local_20->buffer = puVar3;
    local_20->length = sVar4;
    local_20->pos = 0;
    local_20->own = false;
    __position._M_current =
         (this->created_streams).
         super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->created_streams).
        super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>>::
      _M_realloc_insert<Assimp::MemoryIOStream*>
                ((vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>> *)
                 &this->created_streams,__position,&local_20);
    }
    else {
      *__position._M_current = (IOStream *)local_20;
      pppIVar1 = &(this->created_streams).
                  super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    pIVar6 = (this->created_streams).
             super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  }
  else {
    pIVar2 = this->existing_io;
    if (pIVar2 != (IOSystem *)0x0) {
      iVar5 = (*pIVar2->_vptr_IOSystem[4])(pIVar2,pFile,pMode);
      return (IOStream *)CONCAT44(extraout_var,iVar5);
    }
    pIVar6 = (IOStream *)0x0;
  }
  return pIVar6;
}

Assistant:

IOStream* Open(const char* pFile, const char* pMode = "rb") override {
        if ( 0 == strncmp( pFile, AI_MEMORYIO_MAGIC_FILENAME, AI_MEMORYIO_MAGIC_FILENAME_LENGTH ) ) {
            created_streams.emplace_back(new MemoryIOStream(buffer, length));
            return created_streams.back();
        }
        return existing_io ? existing_io->Open(pFile, pMode) : NULL;
    }